

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkGraphicsPipelineLibraryFlagsEXT __thiscall
Fossilize::graphics_pipeline_get_effective_state_flags
          (Fossilize *this,VkGraphicsPipelineCreateInfo *create_info)

{
  VkGraphicsPipelineLibraryFlagsEXT VVar1;
  VkGraphicsPipelineLibraryCreateInfoEXT *pVVar2;
  
  pVVar2 = find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>
                     ((VkStructureType)*(undefined8 *)(this + 8),create_info);
  VVar1 = 0xf;
  if ((pVVar2 != (VkGraphicsPipelineLibraryCreateInfoEXT *)0x0) &&
     ((*(uint *)(this + 0x10) & 0x800) != 0)) {
    VVar1 = pVVar2->flags;
  }
  return VVar1;
}

Assistant:

static VkGraphicsPipelineLibraryFlagsEXT graphics_pipeline_get_effective_state_flags(
		const VkGraphicsPipelineCreateInfo &create_info)
{
	VkGraphicsPipelineLibraryFlagsEXT state_flags =
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_VERTEX_INPUT_INTERFACE_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT;

	auto *graphics_pipeline_library = find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>(
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT,
			create_info.pNext);

	// If we're not creating a library, assume we're defining a complete pipeline.
	if ((create_info.flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && graphics_pipeline_library)
		state_flags = graphics_pipeline_library->flags;

	return state_flags;
}